

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O1

void testQueue(void)

{
  uint32_t uVar1;
  ostream *poVar2;
  int iVar3;
  int x;
  Queue_t queue;
  char local_155;
  uint local_154;
  BinomialQueue<int> local_150;
  
  local_150.mHeight = 0;
  local_150.mNodes.
  super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.mNodes.
  super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.mNodes.
  super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150.mFree = 0xffffffffffffffff;
  memset(&local_150,0xff,0x100);
  iVar3 = 100;
  do {
    uVar1 = rand32();
    local_154 = uVar1 % 0x61;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_154);
    local_155 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_155,1);
    guts::BinomialQueue<int>::push(&local_150,(int *)&local_154);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  guts::BinomialQueue<int>::decrease_key(&local_150,0,0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  if (local_150.mHeight != 0) {
    do {
      iVar3 = guts::BinomialQueue<int>::pop(&local_150);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      local_154 = CONCAT31(local_154._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_154,1);
    } while (local_150.mHeight != 0);
  }
  if (local_150.mNodes.
      super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.mNodes.
                    super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.mNodes.
                          super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.mNodes.
                          super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testQueue()
{
    Queue_t queue;

    for (int i = 0; i != 100; ++i)
    {

        int x = rand32() % 97; 
        
        std::cout << x << ' ';

        queue.push(x);
    }

    queue.decrease_key(0, 0);

    std::cout << std::endl;

    while (!queue.empty())
    {
        int x = queue.pop();

        std::cout << x << ' ';
    }
}